

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O0

int run(char *filename)

{
  byte bVar1;
  bool bVar2;
  command_t *source_00;
  size_type sourceSize;
  ostream *this;
  string local_2e0 [32];
  value_t *local_2c0;
  value_t *result;
  program_t *prog;
  source_t source;
  istream local_288 [8];
  ifstream input;
  undefined1 local_80 [8];
  vm_t vm;
  char *filename_local;
  
  vm.dataStack.result = (value_t *)filename;
  deci::vm_t::vm_t((vm_t *)local_80);
  std::ifstream::ifstream(local_288);
  std::ifstream::open((char *)local_288,(_Ios_Openmode)vm.dataStack.result);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    filename_local._4_4_ = -1;
  }
  else {
    deci::CompileExpression((source_t *)&prog,(char *)vm.dataStack.result,local_288,false);
    source_00 = std::vector<deci::command_t,_std::allocator<deci::command_t>_>::data
                          ((vector<deci::command_t,_std::allocator<deci::command_t>_> *)&prog);
    sourceSize = std::vector<deci::command_t,_std::allocator<deci::command_t>_>::size
                           ((vector<deci::command_t,_std::allocator<deci::command_t>_> *)&prog);
    result = (value_t *)deci::program_t::Create(source_00,sourceSize);
    local_2c0 = deci::vm_t::Run((vm_t *)local_80,result);
    (*result->_vptr_value_t[3])();
    bVar2 = deci::value_t::IsNothing(local_2c0);
    if (!bVar2) {
      (*local_2c0->_vptr_value_t[4])(local_2e0);
      this = std::operator<<((ostream *)&std::cout,local_2e0);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_2e0);
    }
    (*local_2c0->_vptr_value_t[3])();
    filename_local._4_4_ = 0;
    std::vector<deci::command_t,_std::allocator<deci::command_t>_>::~vector
              ((vector<deci::command_t,_std::allocator<deci::command_t>_> *)&prog);
  }
  std::ifstream::~ifstream(local_288);
  deci::vm_t::~vm_t((vm_t *)local_80);
  return filename_local._4_4_;
}

Assistant:

int run(const char* filename) {

  deci::vm_t vm;

  std::ifstream input;
  input.open(filename, std::ios::in);

  if (input.good()) {
    deci::program_t::source_t source = deci::CompileExpression(filename, input,false);
    deci::program_t* prog = deci::program_t::Create(source.data(), source.size());
    deci::value_t* result = vm.Run(*prog);
    prog->Delete();

    if (!result->IsNothing())
    {
      std::cout << result->ToText() << std::endl;
    }
    result->Delete();
    return 0;
  }
  return -1;
}